

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O3

int l_strcmp(TString *ls,TString *rs)

{
  int iVar1;
  size_t sVar2;
  TString *__s1;
  size_t sVar3;
  TString *__s2;
  size_t sVar4;
  
  __s1 = ls + 1;
  __s2 = rs + 1;
  iVar1 = strcoll((char *)__s1,(char *)__s2);
  if (iVar1 == 0) {
    sVar3 = (rs->tsv).len;
    sVar4 = (ls->tsv).len;
    do {
      sVar2 = strlen((char *)__s1);
      if (sVar2 == sVar3) {
        return (uint)(sVar3 != sVar4);
      }
      if (sVar2 == sVar4) {
        return -1;
      }
      __s1 = (TString *)((long)__s1 + sVar2 + 1);
      sVar4 = sVar4 - (sVar2 + 1);
      __s2 = (TString *)((long)__s2 + sVar2 + 1);
      sVar3 = sVar3 - (sVar2 + 1);
      iVar1 = strcoll((char *)__s1,(char *)__s2);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

static int l_strcmp (const TString *ls, const TString *rs) {
  const char *l = getstr(ls);
  size_t ll = ls->tsv.len;
  const char *r = getstr(rs);
  size_t lr = rs->tsv.len;
  for (;;) {
    int temp = strcoll(l, r);
    if (temp != 0) return temp;
    else {  /* strings are equal up to a `\0' */
      size_t len = strlen(l);  /* index of first `\0' in both strings */
      if (len == lr)  /* r is finished? */
        return (len == ll) ? 0 : 1;
      else if (len == ll)  /* l is finished? */
        return -1;  /* l is smaller than r (because r is not finished) */
      /* both strings longer than `len'; go on comparing (after the `\0') */
      len++;
      l += len; ll -= len; r += len; lr -= len;
    }
  }
}